

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O3

int av1_svc_primary_ref_frame(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  if (((cpi->svc).number_spatial_layers < 2) && ((cpi->svc).number_temporal_layers < 2)) {
    if ((cpi->ppi->rtc_ref).set_ref_frame_config == 0) {
      return 7;
    }
    uVar1 = (cpi->ext_flags).ref_frame_flags;
    iVar3 = 0;
    if (((uVar1 & 1) == 0) && (iVar3 = 3, (uVar1 & 8) == 0)) {
      iVar3 = ((uVar1 & 0x40) == 0) + 6;
    }
  }
  else {
    iVar3 = 7;
    if (((cpi->ppi->rtc_ref).reference[0] == 1) &&
       (iVar2 = (cpi->common).remapped_ref_idx[0],
       (cpi->svc).spatial_layer_fb[iVar2] == (cpi->svc).spatial_layer_id)) {
      iVar3 = (cpi->svc).temporal_layer_fb[iVar2];
      iVar2 = 7;
      if (iVar3 < (cpi->svc).temporal_layer_id) {
        iVar2 = 0;
      }
      if (iVar3 == 0) {
        iVar2 = 0;
      }
      return iVar2;
    }
  }
  return iVar3;
}

Assistant:

int av1_svc_primary_ref_frame(const AV1_COMP *const cpi) {
  const SVC *const svc = &cpi->svc;
  const AV1_COMMON *const cm = &cpi->common;
  int fb_idx = -1;
  int primary_ref_frame = PRIMARY_REF_NONE;
  if (cpi->svc.number_spatial_layers > 1 ||
      cpi->svc.number_temporal_layers > 1) {
    // Set the primary_ref_frame to LAST_FRAME if that buffer slot for LAST
    // was last updated on a lower temporal layer (or base TL0) and for the
    // same spatial layer. For RTC patterns this allows for continued decoding
    // when set of enhancement layers are dropped (continued decoding starting
    // at next base TL0), so error_resilience can be off/0 for all layers.
    fb_idx = get_ref_frame_map_idx(cm, LAST_FRAME);
    if (cpi->ppi->rtc_ref.reference[0] == 1 &&
        svc->spatial_layer_fb[fb_idx] == svc->spatial_layer_id &&
        (svc->temporal_layer_fb[fb_idx] < svc->temporal_layer_id ||
         svc->temporal_layer_fb[fb_idx] == 0)) {
      primary_ref_frame = 0;  // LAST_FRAME: ref_frame - LAST_FRAME
    }
  } else if (cpi->ppi->rtc_ref.set_ref_frame_config) {
    const ExternalFlags *const ext_flags = &cpi->ext_flags;
    int flags = ext_flags->ref_frame_flags;
    if (flags & AOM_LAST_FLAG) {
      primary_ref_frame = 0;  // LAST_FRAME: ref_frame - LAST_FRAME
    } else if (flags & AOM_GOLD_FLAG) {
      primary_ref_frame = GOLDEN_FRAME - LAST_FRAME;
    } else if (flags & AOM_ALT_FLAG) {
      primary_ref_frame = ALTREF_FRAME - LAST_FRAME;
    }
  }
  return primary_ref_frame;
}